

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_decode(void)

{
  byte bVar1;
  int *__ptr;
  uint8_t *message;
  size_t message_len;
  char encoded [69];
  undefined1 local_28 [8];
  uint8_t key [32];
  
  bVar1 = paseto_v2_local_load_key_base64(local_28,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
  if ((bVar1 & 1) != 1) {
    __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x1b,"void test_decode(void)");
  }
  memcpy(&message_len,"v2.local.O8cYeF1ljNyMEFqSD0akbinLPPhDXkG0kfdwHmYhwxwxbwdeFmaH_7LwrSw",0x45);
  message = (uint8_t *)0x0;
  __ptr = (int *)paseto_v2_local_decrypt(&message_len,&message,local_28,0);
  if (__ptr == (int *)0x0) {
    perror("paseto_v2_local_decrypt failed");
    __assert_fail("message != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x20,"void test_decode(void)");
  }
  printf("dec: %s\n",__ptr);
  if (message != (uint8_t *)0x4) {
    __assert_fail("message_len == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x22,"void test_decode(void)");
  }
  if (*__ptr != 0x74736574) {
    __assert_fail("memcmp(\"test\", message, 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x23,"void test_decode(void)");
  }
  free(__ptr);
  return;
}

Assistant:

static void test_decode(void) {
    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
    assert(paseto_v2_local_load_key_base64(key, "gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw") == true);
    const char encoded[] = "v2.local.O8cYeF1ljNyMEFqSD0akbinLPPhDXkG0kfdwHmYhwxwxbwdeFmaH_7LwrSw";
    size_t message_len = 0;
    uint8_t *message = paseto_v2_local_decrypt(encoded, &message_len, key, NULL, 0);
    if (!message) perror("paseto_v2_local_decrypt failed");
    assert(message != NULL);
    printf("dec: %s\n", message);
    assert(message_len == 4);
    assert(memcmp("test", message, 4) == 0);
    free(message);
}